

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void triangle_textured(array<vec<3UL,_int>,_3UL> pts,array<vec<2UL,_double>,_3UL> uvs,
                      vector<double,_std::allocator<double>_> *zbuffer,TGAImage *image,Model *model)

{
  double *pdVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  pointer pdVar5;
  double dVar6;
  double dVar7;
  vec3i C;
  vec3i P;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  uint uVar14;
  TGAColor TVar15;
  size_t sVar16;
  size_t sVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  vec3i A;
  vec3i B;
  TGAColor color;
  vec3f bc_screen;
  vec2f local_48;
  
  sVar16 = TGAImage::get_width(image);
  sVar17 = TGAImage::get_height(image);
  iVar13 = pts._M_elems[1].z;
  uVar11 = pts._M_elems[1]._0_8_;
  iVar10 = pts._M_elems[0].z;
  uVar8 = pts._M_elems[0]._0_8_;
  uVar21 = (int)sVar16 - 1;
  uVar14 = (int)sVar17 - 1;
  uVar23 = 0x80000000;
  uVar18 = 0x7fffffff;
  lVar20 = 4;
  uVar24 = 0x7fffffff;
  uVar25 = 0x80000000;
  do {
    uVar3 = *(uint *)((long)&pts._M_elems[0].x + lVar20);
    if ((int)uVar3 < (int)uVar24) {
      uVar24 = uVar3;
    }
    if ((int)uVar24 < 1) {
      uVar24 = 0;
    }
    uVar4 = *(uint *)((long)pts._M_elems + lVar20 + -4);
    if ((int)uVar23 <= (int)uVar4) {
      uVar23 = uVar4;
    }
    if ((int)uVar21 <= (int)uVar23) {
      uVar23 = uVar21;
    }
    if ((int)uVar4 < (int)uVar18) {
      uVar18 = uVar4;
    }
    if ((int)uVar18 < 1) {
      uVar18 = 0;
    }
    if ((int)uVar25 <= (int)uVar3) {
      uVar25 = uVar3;
    }
    if ((int)uVar14 <= (int)uVar25) {
      uVar25 = uVar14;
    }
    lVar20 = lVar20 + 0xc;
  } while (lVar20 != 0x28);
  if ((int)uVar18 <= (int)uVar23) {
    sVar16 = (size_t)uVar18;
    iVar22 = 0;
    do {
      sVar17 = (ulong)uVar24;
      if ((int)uVar24 <= (int)uVar25) {
        do {
          uVar12 = pts._M_elems[1]._0_8_;
          uVar9 = pts._M_elems[0]._0_8_;
          P.y = (int)sVar17;
          P.x = (int)sVar16;
          C.z = pts._M_elems[2].z;
          C.x = pts._M_elems[2].x;
          C.y = pts._M_elems[2].y;
          P.z = iVar22;
          A.z = iVar10;
          pts._M_elems[0].x = (int)uVar8;
          pts._M_elems[0].y = SUB84(uVar8,4);
          A.x = pts._M_elems[0].x;
          A.y = pts._M_elems[0].y;
          B.z = iVar13;
          pts._M_elems[1].x = (int)uVar11;
          pts._M_elems[1].y = SUB84(uVar11,4);
          B.x = pts._M_elems[1].x;
          B.y = pts._M_elems[1].y;
          pts._M_elems[0]._0_8_ = uVar9;
          pts._M_elems[1]._0_8_ = uVar12;
          barycentric(&bc_screen,A,B,C,P);
          if (((0.0 <= bc_screen.x) && (0.0 <= bc_screen.y)) && (0.0 <= bc_screen.z)) {
            lVar20 = 0;
            iVar22 = 0;
            do {
              lVar19 = (ulong)(lVar20 != 0xc) * 8 + 8;
              if (lVar20 == 0) {
                lVar19 = 0;
              }
              iVar22 = iVar22 + (int)((double)*(int *)((long)&pts._M_elems[0].z + lVar20) *
                                     *(double *)((long)&bc_screen.x + lVar19));
              lVar20 = lVar20 + 0xc;
            } while (lVar20 != 0x24);
            pdVar5 = (zbuffer->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            dVar6 = (double)iVar22;
            pdVar1 = pdVar5 + sVar17 * 600 + sVar16;
            if (*pdVar1 <= dVar6 && dVar6 != *pdVar1) {
              pdVar5[sVar17 * 600 + sVar16] = dVar6;
              dVar6 = 0.0;
              dVar7 = 0.0;
              lVar20 = 0;
              do {
                lVar19 = (ulong)(lVar20 != 0x10) * 8 + 8;
                if (lVar20 == 0) {
                  lVar19 = 0;
                }
                dVar2 = *(double *)((long)&bc_screen.x + lVar19);
                dVar6 = dVar6 + dVar2 * *(double *)((long)&uvs._M_elems[0].x + lVar20);
                dVar7 = dVar7 + dVar2 * *(double *)((long)&uvs._M_elems[0].y + lVar20);
                lVar20 = lVar20 + 0x10;
              } while (lVar20 != 0x30);
              local_48.y._0_4_ = SUB84(dVar7,0);
              local_48.x = dVar6;
              local_48.y._4_4_ = (int)((ulong)dVar7 >> 0x20);
              TVar15 = Model::diffuse(model,&local_48);
              color.bgra = TVar15.bgra;
              color.bytespp = TVar15.bytespp;
              TGAImage::set(image,sVar16,sVar17,&color);
            }
          }
          sVar17 = sVar17 + 1;
        } while (uVar25 + 1 != (int)sVar17);
      }
      sVar16 = sVar16 + 1;
    } while (uVar23 + 1 != (int)sVar16);
  }
  return;
}

Assistant:

void triangle_textured(std::array<vec3i, 3> pts, std::array<vec2f, 3> uvs,
                       std::vector<double> &zbuffer, TGAImage &image, Model &model)
{
    vec2i bboxmin(std::numeric_limits<int>::max(), std::numeric_limits<int>::max());
    vec2i bboxmax(std::numeric_limits<int>::min(), std::numeric_limits<int>::min());
    vec2i clamp(image.get_width() - 1, image.get_height() - 1);
    for (int i = 0; i < 3; i++) {
        for (int j = 0; j < 2; j++) {
            bboxmin[j] = std::max(0, std::min(bboxmin[j], pts[i][j]));
            bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
        }
    }
    vec3i P;
    for (P.x = bboxmin.x; P.x <= bboxmax.x; P.x++) {
        for (P.y = bboxmin.y; P.y <= bboxmax.y; P.y++) {
            vec3f bc_screen = barycentric(pts[0], pts[1], pts[2], P);
            if (bc_screen.x < 0 || bc_screen.y < 0 || bc_screen.z < 0) continue;
            P.z = 0;
            for (int i = 0; i < 3; i++) P.z += static_cast<int>(pts[i][2] * bc_screen[i]);
            if (zbuffer[P.x + P.y * width] < P.z) {
                zbuffer[P.x + P.y * width] = P.z;
                vec2f uv{0, 0};
                for (int i = 0; i < 3; i++) {
                    uv.x += uvs[i].x * bc_screen[i];
                    uv.y += uvs[i].y * bc_screen[i];
                }
                TGAColor color = model.diffuse(uv);

                image.set(P.x, P.y, color);
            }
        }
    }
}